

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::get_or_allocate_next_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,uintptr_t i_end_control)

{
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *pLVar1;
  void *pvVar2;
  bool bVar3;
  memory_order mVar4;
  void *pvVar5;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *pLVar6;
  uintptr_t uVar7;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *local_e0;
  uintptr_t expected_tail;
  uintptr_t expected_next;
  ControlBlock *end_control;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *local_b8;
  uintptr_t new_page;
  __int_type updated_tail;
  undefined1 local_a0 [4];
  PinResult pin_result;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> end_block;
  uintptr_t i_end_control_local;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  memory_order __b;
  
  end_block.m_pinned_page = (void *)i_end_control;
  if (((i_end_control == 0) ||
      (bVar3 = uint_is_aligned<unsigned_long>(i_end_control,0x40), pvVar2 = end_block.m_pinned_page,
      !bVar3)) ||
     (pvVar5 = (void *)LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                       ::get_end_control_block((uintptr_t)end_block.m_pinned_page), pvVar2 != pvVar5
     )) {
    density_tests::detail::assert_failed<>
              ("i_end_control != 0 && uint_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x17f);
  }
  if (end_block.m_pinned_page == (void *)0xffc0) {
    uVar7 = create_initial_page(this,i_progress_guarantee);
    return uVar7;
  }
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::PinGuard
            ((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> *)
             local_a0,(basic_default_allocator<65536UL> *)this);
  updated_tail._4_4_ =
       PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::pin
                 ((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>
                   *)local_a0,(uintptr_t)end_block.m_pinned_page);
  if (updated_tail._4_4_ == PinFailed) {
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)0x0;
  }
  else {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    new_page = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)new_page;
    if ((void *)new_page == end_block.m_pinned_page) {
      local_b8 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)create_page(this,i_progress_guarantee);
      if (local_b8 ==
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           *)0x0) {
        this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)0x0;
      }
      else {
        expected_next = (uintptr_t)end_block.m_pinned_page;
        expected_tail = 8;
        bVar3 = raw_atomic_compare_exchange_strong<unsigned_long>
                          ((unsigned_long *)end_block.m_pinned_page,&expected_tail,
                           (unsigned_long)
                           ((long)&(local_b8->m_tail).super___atomic_base<unsigned_long>._M_i + 2),
                           memory_order_seq_cst);
        if (!bVar3) {
          discard_created_page(this,(uintptr_t)local_b8);
          if (expected_tail == 0) {
            this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                          *)new_page;
            goto LAB_021a4239;
          }
          local_b8 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(expected_tail & 0xfffffffffffffff0);
          if ((local_b8 ==
               (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                *)0x0) ||
             (bVar3 = uint_is_aligned<unsigned_long>((unsigned_long)local_b8,0x10000), !bVar3)) {
            density_tests::detail::assert_failed<>
                      ("new_page != 0 && uint_is_aligned(new_page, ALLOCATOR_TYPE::page_alignment)",
                       "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                       ,0x1b0);
          }
        }
        pvVar2 = end_block.m_pinned_page;
        pLVar1 = local_b8;
        local_e0 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                    *)end_block.m_pinned_page;
        mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
        switch(0x21a3d0b) {
        default:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          break;
        case 2:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          break;
        case 3:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          break;
        case 4:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
          else {
            LOCK();
            pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                      *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)pvVar2 == pLVar6;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar1;
              pLVar6 = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_e0 = pLVar6;
            }
          }
        }
        if (bVar3) {
          this_local = local_b8;
        }
        else {
          this_local = local_e0;
        }
      }
    }
  }
LAB_021a4239:
  updated_tail._0_4_ = 1;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::~PinGuard
            ((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> *)
             local_a0);
  return (uintptr_t)this_local;
}

Assistant:

uintptr_t get_or_allocate_next_page(
              LfQueue_ProgressGuarantee const i_progress_guarantee, uintptr_t i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != 0 && uint_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != s_invalid_control_block)
                {
                    /* We are going to access the content of the end control, so we have to do a safe pin
                        (that is, pin the presumed tail, and then check if the tail has changed in the meanwhile). */

                    // try pin
                    PinGuard<ALLOCATOR_TYPE, progress_lock_free> end_block(this);
                    PinResult const pin_result = end_block.pin(i_end_control);
                    if (pin_result == PinFailed) // the pinning can fail only in wait-freedom
                    {
                        return 0;
                    }

                    // check if the tail has changed in the meanwhile
                    auto const updated_tail = m_tail.load(mem_relaxed);
                    if (updated_tail != i_end_control)
                    {
                        return updated_tail;
                    }
                    // now the end control block is pinned, we can safely access it

                    // allocate and setup a new page
                    uintptr_t new_page = create_page(i_progress_guarantee);
                    if (new_page == 0)
                    {
                        return 0;
                    }

                    auto const end_control   = reinterpret_cast<ControlBlock *>(i_end_control);
                    uintptr_t  expected_next = LfQueue_InvalidNextPage;
                    if (!raw_atomic_compare_exchange_strong(
                          &end_control->m_next, &expected_next, new_page + LfQueue_Dead))
                    {
                        /* Some other thread has already linked a new page. We discard the page we
                            have just allocated. */
                        discard_created_page(new_page);

                        /* So i_end_control->m_next may now be the pointer to the next page
                            or 0 (if the page has been consumed in the meanwhile). */
                        if (expected_next == 0)
                        {
                            return updated_tail;
                        }

                        new_page = expected_next & ~LfQueue_AllFlags;
                        DENSITY_ASSERT_INTERNAL(
                          new_page != 0 &&
                          uint_is_aligned(new_page, ALLOCATOR_TYPE::page_alignment));
                    }

                    auto expected_tail = i_end_control;
                    if (m_tail.compare_exchange_strong(expected_tail, new_page))
                        return new_page;
                    else
                        return expected_tail;
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }